

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.cpp
# Opt level: O1

void ncnn::quantize(float *ptr,char *s8ptr,Mat *scale_data,int elemcount,int elempack)

{
  float fVar1;
  undefined1 (*pauVar2) [32];
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  float fVar10;
  float fVar15;
  float fVar16;
  undefined1 auVar11 [16];
  float fVar17;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar42 [64];
  undefined1 auVar14 [28];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar41 [32];
  
  pauVar2 = (undefined1 (*) [32])scale_data->data;
  fVar1 = *(float *)*pauVar2;
  auVar11._4_4_ = fVar1;
  auVar11._0_4_ = fVar1;
  auVar11._8_4_ = fVar1;
  auVar11._12_4_ = fVar1;
  auVar14._16_4_ = fVar1;
  auVar14._0_16_ = auVar11;
  auVar14._20_4_ = fVar1;
  auVar14._24_4_ = fVar1;
  uVar6 = elemcount * elempack;
  if (1 < scale_data->w) {
    if (elempack == 8) {
      auVar14 = SUB3228(*pauVar2,0);
    }
    if (elempack == 4) {
      auVar11 = *(undefined1 (*) [16])*pauVar2;
      auVar9._16_16_ = auVar11;
      auVar9._0_16_ = auVar11;
      auVar14 = auVar9._0_28_;
    }
  }
  uVar3 = 0;
  fVar10 = auVar14._0_4_;
  fVar15 = auVar14._4_4_;
  fVar16 = auVar14._8_4_;
  fVar17 = auVar14._12_4_;
  fVar18 = auVar14._16_4_;
  fVar19 = auVar14._20_4_;
  fVar20 = auVar14._24_4_;
  if (0xf < (int)uVar6) {
    uVar3 = uVar6 & 0x7ffffff0;
    iVar7 = 0xf;
    auVar22._8_4_ = 0x80000000;
    auVar22._0_8_ = 0x8000000080000000;
    auVar22._12_4_ = 0x80000000;
    auVar22._16_4_ = 0x80000000;
    auVar22._20_4_ = 0x80000000;
    auVar22._24_4_ = 0x80000000;
    auVar22._28_4_ = 0x80000000;
    auVar25._8_4_ = 0x3f000000;
    auVar25._0_8_ = 0x3f0000003f000000;
    auVar25._12_4_ = 0x3f000000;
    auVar25._16_4_ = 0x3f000000;
    auVar25._20_4_ = 0x3f000000;
    auVar25._24_4_ = 0x3f000000;
    auVar25._28_4_ = 0x3f000000;
    auVar27._8_4_ = 0x7f007f;
    auVar27._0_8_ = 0x7f007f007f007f;
    auVar27._12_4_ = 0x7f007f;
    auVar30._8_4_ = 0xff81ff81;
    auVar30._0_8_ = 0xff81ff81ff81ff81;
    auVar30._12_4_ = 0xff81ff81;
    do {
      auVar38._0_4_ = fVar10 * *ptr;
      auVar38._4_4_ = fVar15 * ptr[1];
      auVar38._8_4_ = fVar16 * ptr[2];
      auVar38._12_4_ = fVar17 * ptr[3];
      auVar38._16_4_ = fVar18 * ptr[4];
      auVar38._20_4_ = fVar19 * ptr[5];
      auVar38._28_36_ = in_ZMM7._28_36_;
      auVar38._24_4_ = fVar20 * ptr[6];
      auVar42._0_4_ = fVar10 * ptr[8];
      auVar42._4_4_ = fVar15 * ptr[9];
      auVar42._8_4_ = fVar16 * ptr[10];
      auVar42._12_4_ = fVar17 * ptr[0xb];
      auVar42._16_4_ = fVar18 * ptr[0xc];
      auVar42._20_4_ = fVar19 * ptr[0xd];
      auVar42._28_36_ = in_ZMM8._28_36_;
      auVar42._24_4_ = fVar20 * ptr[0xe];
      auVar9 = vandps_avx(auVar38._0_32_,auVar22);
      auVar23 = vandps_avx(auVar42._0_32_,auVar22);
      auVar9 = vorps_avx(auVar9,auVar25);
      auVar23 = vorps_avx(auVar23,auVar25);
      auVar34._0_4_ = (int)(auVar9._0_4_ + auVar38._0_4_);
      auVar34._4_4_ = (int)(auVar9._4_4_ + auVar38._4_4_);
      auVar34._8_4_ = (int)(auVar9._8_4_ + auVar38._8_4_);
      auVar34._12_4_ = (int)(auVar9._12_4_ + auVar38._12_4_);
      auVar36._16_4_ = (int)(auVar9._16_4_ + auVar38._16_4_);
      auVar36._0_16_ = auVar34;
      auVar36._20_4_ = (int)(auVar9._20_4_ + auVar38._20_4_);
      auVar36._24_4_ = (int)(auVar9._24_4_ + auVar38._24_4_);
      auVar36._28_4_ = (int)(auVar9._28_4_ + in_ZMM7._28_4_);
      auVar40._0_4_ = (int)(auVar42._0_4_ + auVar23._0_4_);
      auVar40._4_4_ = (int)(auVar42._4_4_ + auVar23._4_4_);
      auVar40._8_4_ = (int)(auVar42._8_4_ + auVar23._8_4_);
      auVar40._12_4_ = (int)(auVar42._12_4_ + auVar23._12_4_);
      auVar41._16_4_ = (int)(auVar42._16_4_ + auVar23._16_4_);
      auVar41._0_16_ = auVar40;
      auVar41._20_4_ = (int)(auVar42._20_4_ + auVar23._20_4_);
      auVar41._24_4_ = (int)(auVar42._24_4_ + auVar23._24_4_);
      auVar41._28_4_ = (int)(in_ZMM8._28_4_ + auVar23._28_4_);
      auVar34 = vpackssdw_avx(auVar34,auVar36._16_16_);
      auVar40 = vpackssdw_avx(auVar40,auVar41._16_16_);
      auVar34 = vpminsw_avx(auVar34,auVar27);
      auVar40 = vpminsw_avx(auVar40,auVar27);
      auVar34 = vpmaxsw_avx(auVar34,auVar30);
      auVar40 = vpmaxsw_avx(auVar40,auVar30);
      in_ZMM8 = ZEXT1664(auVar40);
      auVar34 = vpacksswb_avx(auVar34,auVar40);
      in_ZMM7 = ZEXT1664(auVar34);
      *(undefined1 (*) [16])s8ptr = auVar34;
      ptr = ptr + 0x10;
      s8ptr = (char *)((long)s8ptr + 0x10);
      iVar7 = iVar7 + 0x10;
    } while (iVar7 < (int)uVar6);
  }
  if ((int)(uVar3 | 7) < (int)uVar6) {
    auVar23._8_4_ = 0x80000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar23._12_4_ = 0x80000000;
    auVar23._16_4_ = 0x80000000;
    auVar23._20_4_ = 0x80000000;
    auVar23._24_4_ = 0x80000000;
    auVar23._28_4_ = 0x80000000;
    auVar26._8_4_ = 0x3f000000;
    auVar26._0_8_ = 0x3f0000003f000000;
    auVar26._12_4_ = 0x3f000000;
    auVar26._16_4_ = 0x3f000000;
    auVar26._20_4_ = 0x3f000000;
    auVar26._24_4_ = 0x3f000000;
    auVar26._28_4_ = 0x3f000000;
    auVar28._8_4_ = 0x7f007f;
    auVar28._0_8_ = 0x7f007f007f007f;
    auVar28._12_4_ = 0x7f007f;
    auVar31._8_4_ = 0xff81ff81;
    auVar31._0_8_ = 0xff81ff81ff81ff81;
    auVar31._12_4_ = 0xff81ff81;
    uVar4 = uVar3;
    do {
      auVar39._0_4_ = fVar10 * *ptr;
      auVar39._4_4_ = fVar15 * ptr[1];
      auVar39._8_4_ = fVar16 * ptr[2];
      auVar39._12_4_ = fVar17 * ptr[3];
      auVar39._16_4_ = fVar18 * ptr[4];
      auVar39._20_4_ = fVar19 * ptr[5];
      auVar39._28_36_ = in_ZMM7._28_36_;
      auVar39._24_4_ = fVar20 * ptr[6];
      auVar9 = vandps_avx(auVar39._0_32_,auVar23);
      auVar9 = vorps_avx(auVar9,auVar26);
      auVar35._0_4_ = (int)(auVar9._0_4_ + auVar39._0_4_);
      auVar35._4_4_ = (int)(auVar9._4_4_ + auVar39._4_4_);
      auVar35._8_4_ = (int)(auVar9._8_4_ + auVar39._8_4_);
      auVar35._12_4_ = (int)(auVar9._12_4_ + auVar39._12_4_);
      auVar37._16_4_ = (int)(auVar9._16_4_ + auVar39._16_4_);
      auVar37._0_16_ = auVar35;
      auVar37._20_4_ = (int)(auVar9._20_4_ + auVar39._20_4_);
      auVar37._24_4_ = (int)(auVar9._24_4_ + auVar39._24_4_);
      auVar37._28_4_ = (int)(auVar9._28_4_ + in_ZMM7._28_4_);
      auVar27 = vpackssdw_avx(auVar35,auVar37._16_16_);
      auVar27 = vpminsw_avx(auVar27,auVar28);
      auVar27 = vpmaxsw_avx(auVar27,auVar31);
      auVar27 = vpacksswb_avx(auVar27,auVar27);
      in_ZMM7 = ZEXT1664(auVar27);
      *(long *)*(undefined1 (*) [16])s8ptr = auVar27._0_8_;
      ptr = ptr + 8;
      s8ptr = *(undefined1 (*) [16])s8ptr + 8;
      uVar3 = uVar4 + 8;
      iVar7 = uVar4 + 0xf;
      uVar4 = uVar3;
    } while (iVar7 < (int)uVar6);
  }
  if ((int)(uVar3 | 3) < (int)uVar6) {
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar21._8_4_ = 0x3f000000;
    auVar21._0_8_ = 0x3f0000003f000000;
    auVar21._12_4_ = 0x3f000000;
    auVar24._8_4_ = 0x7f007f;
    auVar24._0_8_ = 0x7f007f007f007f;
    auVar24._12_4_ = 0x7f007f;
    auVar29._8_4_ = 0xff81ff81;
    auVar29._0_8_ = 0xff81ff81ff81ff81;
    auVar29._12_4_ = 0xff81ff81;
    uVar4 = uVar3;
    do {
      auVar32._0_4_ = auVar11._0_4_ * *ptr;
      auVar32._4_4_ = auVar11._4_4_ * ptr[1];
      auVar32._8_4_ = auVar11._8_4_ * ptr[2];
      auVar32._12_4_ = auVar11._12_4_ * ptr[3];
      auVar27 = vandps_avx(auVar32,auVar12);
      auVar27 = vorps_avx(auVar27,auVar21);
      auVar33._0_4_ = (int)(auVar32._0_4_ + auVar27._0_4_);
      auVar33._4_4_ = (int)(auVar32._4_4_ + auVar27._4_4_);
      auVar33._8_4_ = (int)(auVar32._8_4_ + auVar27._8_4_);
      auVar33._12_4_ = (int)(auVar32._12_4_ + auVar27._12_4_);
      auVar27 = vpackssdw_avx(auVar33,auVar33);
      auVar27 = vpminsw_avx(auVar27,auVar24);
      auVar27 = vpmaxsw_avx(auVar27,auVar29);
      auVar27 = vpacksswb_avx(auVar27,auVar27);
      *(int *)*(undefined1 (*) [16])s8ptr = auVar27._0_4_;
      ptr = ptr + 4;
      s8ptr = *(undefined1 (*) [16])s8ptr + 4;
      uVar3 = uVar4 + 4;
      iVar7 = uVar4 + 7;
      uVar4 = uVar3;
    } while (iVar7 < (int)uVar6);
  }
  if (uVar6 - uVar3 != 0 && (int)uVar3 <= (int)uVar6) {
    lVar5 = 0;
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar13._8_4_ = 0x3effffff;
    auVar13._0_8_ = 0x3effffff3effffff;
    auVar13._12_4_ = 0x3effffff;
    do {
      auVar11 = vandps_avx(ZEXT416((uint)(fVar1 * ptr[lVar5])),auVar8);
      auVar11 = vorps_avx(auVar11,auVar13);
      auVar11 = ZEXT416((uint)(fVar1 * ptr[lVar5] + auVar11._0_4_));
      auVar11 = vroundss_avx(auVar11,auVar11,0xb);
      iVar7 = (int)auVar11._0_4_;
      if (iVar7 < -0x7e) {
        iVar7 = -0x7f;
      }
      if (0x7e < iVar7) {
        iVar7 = 0x7f;
      }
      (*(undefined1 (*) [16])s8ptr)[lVar5] = (char)iVar7;
      lVar5 = lVar5 + 1;
    } while (uVar6 - uVar3 != (int)lVar5);
  }
  return;
}

Assistant:

static void quantize(const float* ptr, signed char* s8ptr, const Mat& scale_data, int elemcount, int elempack)
{
    const int scale_data_size = scale_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("quantize %d   %d %d", scale_data_size, elemcount, elempack);

    float scale = scale_data[0];
#if __SSE2__
    __m128 _scale = _mm_set1_ps(scale);
#if __AVX__
    __m256 _scale_avx = _mm256_set1_ps(scale);
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#endif // __AVX512F__
#endif // __AVX__
    if (scale_data_size > 1)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_avx512 = _mm512_loadu_ps((const float*)scale_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            _scale_avx = _mm256_loadu_ps((const float*)scale_data);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
        }
#endif // __AVX__
        if (elempack == 4)
        {
            _scale = _mm_loadu_ps((const float*)scale_data);
#if __AVX__
            _scale_avx = combine4x2_ps(_scale, _scale);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
#endif // __AVX__
        }
    }
#endif // __SSE2__

    int i = 0;
#if __SSE2__
#if __AVX__
    for (; i + 15 < size; i += 16)
    {
#if __AVX512F__
        __m512 _v = _mm512_loadu_ps(ptr);
        _v = _mm512_mul_ps(_v, _scale_avx512);
        _mm_storeu_si128((__m128i*)s8ptr, float2int8_avx512(_v));
#else  // __AVX512F__
        __m256 _v0 = _mm256_loadu_ps(ptr);
        __m256 _v1 = _mm256_loadu_ps(ptr + 8);
        _v0 = _mm256_mul_ps(_v0, _scale_avx);
        _v1 = _mm256_mul_ps(_v1, _scale_avx);
        _mm_storeu_si128((__m128i*)s8ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
        ptr += 16;
        s8ptr += 16;
    }
#endif // __AVX__
    for (; i + 7 < size; i += 8)
    {
#if __AVX__
        __m256 _v = _mm256_loadu_ps(ptr);
        _v = _mm256_mul_ps(_v, _scale_avx);
        *(int64_t*)s8ptr = float2int8_avx(_v);
#else  // __AVX__
        __m128 _v0 = _mm_loadu_ps(ptr);
        __m128 _v1 = _mm_loadu_ps(ptr + 4);
        _v0 = _mm_mul_ps(_v0, _scale);
        _v1 = _mm_mul_ps(_v1, _scale);
        *(int64_t*)s8ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
        ptr += 8;
        s8ptr += 8;
    }
    for (; i + 3 < size; i += 4)
    {
        __m128 _v = _mm_loadu_ps(ptr);
        _v = _mm_mul_ps(_v, _scale);
        int32_t v = float2int8_sse(_v);
        s8ptr[0] = (v >> 0) & 0xff;
        s8ptr[1] = (v >> 8) & 0xff;
        s8ptr[2] = (v >> 16) & 0xff;
        s8ptr[3] = (v >> 24) & 0xff;
        ptr += 4;
        s8ptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        float v = *ptr * scale;
        *s8ptr = float2int8(v);
        ptr++;
        s8ptr++;
    }
}